

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

int loader_impl_dependencies(loader_impl impl)

{
  bool bVar1;
  type_id tVar2;
  value pvVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  dynlink pdVar7;
  char *pcVar8;
  undefined8 *in_RDI;
  char *dependency;
  dynlink handle;
  char *library_path;
  int found;
  size_t path;
  size_t paths_size;
  value *paths_array;
  value *library_tuple;
  size_t iterator;
  value *dependencies_map;
  size_t size;
  value dependencies_value;
  void *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  configuration in_stack_ffffffffffffff78;
  value in_stack_ffffffffffffff80;
  dynlink_path in_stack_ffffffffffffff88;
  ulong local_50;
  ulong local_30;
  
  pvVar3 = configuration_value_type
                     (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                      (type_id)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  if (pvVar3 != (value)0x0) {
    sVar4 = value_type_count(in_stack_ffffffffffffff68);
    value_to_map((value)0x12ff42);
    for (local_30 = 0; local_30 < sVar4; local_30 = local_30 + 1) {
      tVar2 = value_type_id(in_stack_ffffffffffffff80);
      if (tVar2 == 9) {
        value_to_array((value)0x12ff8f);
        tVar2 = value_type_id(in_stack_ffffffffffffff80);
        if (tVar2 == 9) {
          value_to_array((value)0x12ffb9);
          sVar5 = value_type_count(in_stack_ffffffffffffff68);
          bVar1 = false;
          for (local_50 = 0; local_50 < sVar5; local_50 = local_50 + 1) {
            tVar2 = value_type_id(in_stack_ffffffffffffff80);
            if (((tVar2 == 7) && (pcVar6 = value_to_string((value)0x130019), pcVar6 != (char *)0x0))
               && (pdVar7 = dynlink_load_absolute
                                      (in_stack_ffffffffffffff88,
                                       (dynlink_flags)((ulong)in_stack_ffffffffffffff80 >> 0x20)),
                  pdVar7 != (dynlink)0x0)) {
              bVar1 = true;
              break;
            }
          }
          if (!bVar1) {
            tVar2 = value_type_id(in_stack_ffffffffffffff80);
            if (tVar2 == 7) {
              pcVar6 = value_to_string((value)0x13008c);
            }
            else {
              pcVar6 = "unknown_library";
            }
            pcVar8 = plugin_name((plugin)*in_RDI);
            log_write_impl_va("metacall",0x159,"loader_impl_dependencies",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                              ,LOG_LEVEL_ERROR,
                              "Failed to load dependency \'%s\' from loader configuration \'%s.json\'"
                              ,pcVar6,pcVar8);
            return 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int loader_impl_dependencies(loader_impl impl)
{
	/* Dependencies have the following format */
	/*
	{
		"dependencies": {
			"node": ["/usr/lib/x86_64-linux-gnu/libnode.so.72"]
		}
	}
	*/
	value dependencies_value = configuration_value_type(impl->config, "dependencies", TYPE_MAP);

	if (dependencies_value != NULL)
	{
		size_t size = value_type_count(dependencies_value);
		value *dependencies_map = value_to_map(dependencies_value);
		size_t iterator;

		for (iterator = 0; iterator < size; ++iterator)
		{
			if (value_type_id(dependencies_map[iterator]) == TYPE_ARRAY)
			{
				value *library_tuple = value_to_array(dependencies_map[iterator]);

				if (value_type_id(library_tuple[1]) == TYPE_ARRAY)
				{
					value *paths_array = value_to_array(library_tuple[1]);
					size_t paths_size = value_type_count(library_tuple[1]);
					size_t path;
					int found = 0;

					for (path = 0; path < paths_size; ++path)
					{
						if (value_type_id(paths_array[iterator]) == TYPE_STRING)
						{
							const char *library_path = value_to_string(paths_array[iterator]);

							if (library_path != NULL)
							{
								dynlink handle = dynlink_load_absolute(library_path, DYNLINK_FLAGS_BIND_LAZY | DYNLINK_FLAGS_BIND_GLOBAL);

								if (handle != NULL)
								{
									found = 1;
									break;
								}
							}
						}
					}

					if (!found)
					{
						const char *dependency = value_type_id(library_tuple[0]) == TYPE_STRING ? value_to_string(library_tuple[0]) : "unknown_library";
						log_write("metacall", LOG_LEVEL_ERROR, "Failed to load dependency '%s' from loader configuration '%s.json'", dependency, plugin_name(impl->p));
						return 1;
					}
				}
			}
		}
	}

	return 0;
}